

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O3

Box * BoxNesting::Parser::parseBoxSpecification(Box *__return_storage_ptr__,istream *inputStream)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  int *piVar4;
  pointer psVar5;
  ostream *poVar6;
  runtime_error *this;
  undefined8 uVar7;
  long lVar8;
  float fVar9;
  smatch match;
  string inputLine;
  stringstream ss;
  ostream *local_268 [4];
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_248;
  float local_224;
  float local_220;
  float local_21c;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_218;
  long local_210;
  char local_208;
  undefined7 uStack_207;
  undefined1 local_1b8 [16];
  ostream local_1a8;
  undefined7 uStack_1a7;
  
  local_218._M_current = &local_208;
  local_210 = 0;
  local_208 = '\0';
  cVar1 = std::ios::widen((char)*(undefined8 *)(*(long *)inputStream + -0x18) + (char)inputStream);
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            (inputStream,(string *)&local_218,cVar1);
  if (parseBoxSpecification(std::istream&)::boxRegex_abi_cxx11_ == '\0') {
    iVar3 = __cxa_guard_acquire(&parseBoxSpecification(std::istream&)::boxRegex_abi_cxx11_);
    if (iVar3 != 0) {
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                (&parseBoxSpecification(std::istream&)::boxRegex_abi_cxx11_,
                 "\\s*(\\d*.\\d+)\\s+(\\d*.\\d+)\\s+(\\d*.\\d+)",0x10);
      __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex,
                   &parseBoxSpecification(std::istream&)::boxRegex_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&parseBoxSpecification(std::istream&)::boxRegex_abi_cxx11_);
    }
  }
  local_248.
  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_248._M_begin._M_current = (char *)0x0;
  local_248.
  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_248.
  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  bVar2 = std::__detail::
          __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,true>
                    (local_218,
                     (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )(local_218._M_current + local_210),&local_248,
                     &parseBoxSpecification(std::istream&)::boxRegex_abi_cxx11_,0);
  if (!bVar2) {
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>
              (&local_1a8,"Expected a box specification in the form of \"x.x y.y z.z\". Got: \"",
               0x41);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (&local_1a8,local_218._M_current,local_210);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\"",1);
    this = (runtime_error *)__cxa_allocate_exception(0x18);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(this,(string *)local_268);
    *(undefined ***)this = &PTR__ParserError_0011fab8;
    *(undefined8 *)(this + 0x10) = 0;
    __cxa_throw(this,&ParserError::typeinfo,ParserError::~ParserError);
  }
  lVar8 = (long)local_248.
                super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                .
                super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)local_248.
                super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                .
                super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  if ((lVar8 == 0) || (0xfffffffffffffffd < (lVar8 >> 3) * -0x5555555555555555 - 5U)) {
    psVar5 = (pointer)((long)local_248.
                             super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                             .
                             super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + lVar8 + -0x48);
  }
  else {
    psVar5 = local_248.
             super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             .
             super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 1;
  }
  if (psVar5->matched == true) {
    local_1b8._0_8_ = &local_1a8;
    std::__cxx11::string::
    _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
              ((string *)local_1b8,
               (psVar5->
               super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ).first._M_current,
               (psVar5->
               super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ).second._M_current);
  }
  else {
    local_1b8._0_8_ = &local_1a8;
    local_1b8._8_8_ = 0;
    local_1a8 = (ostream)0x0;
  }
  uVar7 = local_1b8._0_8_;
  piVar4 = __errno_location();
  iVar3 = *piVar4;
  *piVar4 = 0;
  local_21c = strtof((char *)uVar7,(char **)local_268);
  if (local_268[0] == (ostream *)uVar7) {
    std::__throw_invalid_argument("stof");
  }
  else {
    if (*piVar4 == 0) {
LAB_00105fa6:
      *piVar4 = iVar3;
    }
    else if (*piVar4 == 0x22) {
      std::__throw_out_of_range("stof");
      goto LAB_00105fa6;
    }
    if ((ostream *)local_1b8._0_8_ != &local_1a8) {
      operator_delete((void *)local_1b8._0_8_,CONCAT71(uStack_1a7,local_1a8) + 1);
    }
    lVar8 = (long)local_248.
                  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  .
                  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)local_248.
                  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  .
                  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    if ((lVar8 == 0) || (0xfffffffffffffffc < (lVar8 >> 3) * -0x5555555555555555 - 6U)) {
      psVar5 = (pointer)((long)local_248.
                               super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                               .
                               super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + lVar8 + -0x48);
    }
    else {
      psVar5 = local_248.
               super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               .
               super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + 2;
    }
    if (psVar5->matched == true) {
      local_1b8._0_8_ = &local_1a8;
      std::__cxx11::string::
      _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                ((string *)local_1b8,
                 (psVar5->
                 super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ).first._M_current,
                 (psVar5->
                 super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ).second._M_current);
    }
    else {
      local_1b8._8_8_ = 0;
      local_1a8 = (ostream)0x0;
      local_1b8._0_8_ = &local_1a8;
    }
    uVar7 = local_1b8._0_8_;
    iVar3 = *piVar4;
    *piVar4 = 0;
    local_220 = strtof((char *)local_1b8._0_8_,(char **)local_268);
    if (local_268[0] != (ostream *)uVar7) {
      if (*piVar4 == 0) {
LAB_00106087:
        *piVar4 = iVar3;
      }
      else if (*piVar4 == 0x22) {
        std::__throw_out_of_range("stof");
        goto LAB_00106087;
      }
      if ((ostream *)local_1b8._0_8_ != &local_1a8) {
        operator_delete((void *)local_1b8._0_8_,CONCAT71(uStack_1a7,local_1a8) + 1);
      }
      lVar8 = (long)local_248.
                    super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    .
                    super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_248.
                    super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    .
                    super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
      if ((lVar8 == 0) || (0xfffffffffffffffb < (lVar8 >> 3) * -0x5555555555555555 - 7U)) {
        psVar5 = (pointer)((long)local_248.
                                 super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                 .
                                 super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start + lVar8 + -0x48);
      }
      else {
        psVar5 = local_248.
                 super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 .
                 super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + 3;
      }
      if (psVar5->matched == true) {
        local_1b8._0_8_ = &local_1a8;
        std::__cxx11::string::
        _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                  ((string *)local_1b8,
                   (psVar5->
                   super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ).first._M_current,
                   (psVar5->
                   super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ).second._M_current);
      }
      else {
        local_1b8._8_8_ = 0;
        local_1a8 = (ostream)0x0;
        local_1b8._0_8_ = &local_1a8;
      }
      uVar7 = local_1b8._0_8_;
      iVar3 = *piVar4;
      *piVar4 = 0;
      fVar9 = strtof((char *)local_1b8._0_8_,(char **)local_268);
      if (local_268[0] != (ostream *)uVar7) {
        if (*piVar4 != 0) {
          if (*piVar4 != 0x22) goto LAB_00106168;
          std::__throw_out_of_range("stof");
        }
        *piVar4 = iVar3;
LAB_00106168:
        if ((ostream *)local_1b8._0_8_ != &local_1a8) {
          local_224 = fVar9;
          operator_delete((void *)local_1b8._0_8_,CONCAT71(uStack_1a7,local_1a8) + 1);
          fVar9 = local_224;
        }
        local_1b8._4_4_ = local_220;
        local_1b8._0_4_ = local_21c;
        local_1b8._8_4_ = fVar9;
        Box::Box(__return_storage_ptr__,(array<float,_3UL> *)local_1b8);
        if (local_248.
            super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            .
            super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_248.
                          super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          .
                          super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_248.
                                super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                .
                                super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_248.
                                super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                .
                                super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if (local_218._M_current != &local_208) {
          operator_delete(local_218._M_current,CONCAT71(uStack_207,local_208) + 1);
        }
        return __return_storage_ptr__;
      }
      goto LAB_0010631f;
    }
  }
  std::__throw_invalid_argument("stof");
LAB_0010631f:
  uVar7 = std::__throw_invalid_argument("stof");
  __cxa_guard_abort(&parseBoxSpecification(std::istream&)::boxRegex_abi_cxx11_);
  if (local_218._M_current != &local_208) {
    operator_delete(local_218._M_current,CONCAT71(uStack_207,local_208) + 1);
  }
  _Unwind_Resume(uVar7);
}

Assistant:

Box Parser::parseBoxSpecification(std::istream& inputStream)
{
	std::string inputLine;
	std::getline(inputStream, inputLine);

	static const std::regex boxRegex(R"(\s*(\d*.\d+)\s+(\d*.\d+)\s+(\d*.\d+))");
	std::smatch match;

	if (!std::regex_match(inputLine, match, boxRegex)) {
		std::stringstream ss;
		ss << R"(Expected a box specification in the form of "x.x y.y z.z". Got: ")" << inputLine << "\"";
		throw ParserError(ss.str());
	}

	float x = 0;
	float y = 0;
	float z = 0;

	try {
		x = std::stof(match[1].str());
		y = std::stof(match[2].str());
		z = std::stof(match[3].str());
	} catch (const std::out_of_range& e) {
		std::stringstream ss;
		ss << "x, y or z length of box is out of range of floats range, got x: " << match[1].str()
		   << ", y: " << match[2].str() << ", z: " << match[3].str();
		throw ParserError(ss.str(), e);
	}

	return Box({x, y, z});
}